

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O2

size_t arangodb::velocypack::anon_unknown_0::JSONSkipWhiteSpaceSSE42(uint8_t *ptr,size_t limit)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  for (; 0xf < limit; limit = limit - 0x10) {
    iVar1 = pcmpistri(_DAT_00119cf0,*(undefined1 (*) [16])ptr,0x10);
    if (iVar1 < 0x10) goto LAB_001144aa;
    ptr = (uint8_t *)((long)ptr + 0x10);
    lVar2 = lVar2 + -0x10;
  }
  if (limit == 0) {
    return -lVar2;
  }
  iVar1 = pcmpistri(_DAT_00119cf0,*(undefined1 (*) [16])ptr,0x10);
  if (limit < (ulong)(long)iVar1) {
    iVar1 = (int)limit;
  }
LAB_001144aa:
  return iVar1 - lVar2;
}

Assistant:

std::size_t JSONSkipWhiteSpaceSSE42(uint8_t const* ptr, std::size_t limit) {
  alignas(16) static char const white[17] = " \t\n\r            ";
  __m128i const w = _mm_load_si128(reinterpret_cast<__m128i const*>(white));
  std::size_t count = 0;
  int x = 0;
  while (limit >= 16) {
    __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(ptr));
    x = _mm_cmpistri(w, /* 4, */ s, /*  16, */
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY |
                         _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
    if (x < 16) {
      count += x;
      return count;
    }
    ptr += 16;
    limit -= 16;
    count += 16;
  }
  if (limit == 0) {
    return count;
  }
  __m128i const s = _mm_loadu_si128(reinterpret_cast<__m128i const*>(ptr));
  x = _mm_cmpistri(w, /* 4, */ s, /* limit, */
                   _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY |
                       _SIDD_NEGATIVE_POLARITY | _SIDD_LEAST_SIGNIFICANT);
  if (static_cast<std::size_t>(x) > limit) {
    x = static_cast<int>(limit);
  }
  count += x;
  return count;
}